

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_buffer.cpp
# Opt level: O0

bool dxil_spv::emit_raw_buffer_load_instruction(Impl *impl,CallInst *instruction)

{
  CallInst *pCVar1;
  bool bVar2;
  Id IVar3;
  TypeID TVar4;
  uint uVar5;
  Value *pVVar6;
  mapped_type *pmVar7;
  Type *pTVar8;
  LoggingCallback p_Var9;
  void *pvVar10;
  char local_1048 [8];
  char buffer [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb;
  Type *ret_component;
  mapped_type *meta;
  CallInst *pCStack_20;
  Id ptr_id;
  CallInst *instruction_local;
  Impl *impl_local;
  
  pCStack_20 = instruction;
  instruction_local = (CallInst *)impl;
  if (((impl->ags).num_instructions == 1) &&
     (pVVar6 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,2),
     pCVar1 = instruction_local,
     pVVar6 == (Value *)instruction_local[8].super_Instruction.operands.
                        super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish)) {
    pVVar6 = LLVMBC::Instruction::getOperand(&pCStack_20->super_Instruction,1);
    IVar3 = Converter::Impl::get_id_for_value((Impl *)pCVar1,pVVar6,0);
    *(Id *)((long)&instruction_local[6].super_Instruction.super_Value.tween_id + 4) = IVar3;
    *(undefined4 *)&instruction_local[6].super_Instruction.is_terminator = 0x8b;
    instruction_local[9].super_Instruction.attachments._M_h._M_single_bucket =
         (__node_base_ptr)pCStack_20;
    impl_local._7_1_ = true;
  }
  else {
    bVar2 = Converter::Impl::composite_is_accessed((Impl *)instruction_local,(Value *)pCStack_20);
    pCVar1 = instruction_local;
    if (bVar2) {
      pVVar6 = LLVMBC::Instruction::getOperand(&pCStack_20->super_Instruction,1);
      meta._4_4_ = Converter::Impl::get_id_for_value((Impl *)pCVar1,pVVar6,0);
      pmVar7 = std::
               unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>_>
               ::operator[]((unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>_>
                             *)&instruction_local[0xf].super_Instruction.attachments._M_h.
                                _M_rehash_policy._M_next_resize,(key_type *)((long)&meta + 4));
      if (pmVar7->storage == StorageClassPhysicalStorageBuffer) {
        impl_local._7_1_ =
             emit_physical_buffer_load_instruction
                       ((Impl *)instruction_local,pCStack_20,&pmVar7->physical_pointer_meta,0,0);
      }
      else {
        pTVar8 = LLVMBC::Value::getType((Value *)pCStack_20);
        pTVar8 = LLVMBC::Type::getStructElementType(pTVar8,0);
        TVar4 = LLVMBC::Type::getTypeID(pTVar8);
        if ((TVar4 == FloatTyID) ||
           (((TVar4 = LLVMBC::Type::getTypeID(pTVar8), TVar4 == IntegerTyID &&
             (uVar5 = LLVMBC::Type::getIntegerBitWidth(pTVar8), uVar5 == 0x20)) ||
            (pmVar7->storage == StorageClassStorageBuffer)))) {
          impl_local._7_1_ = emit_buffer_load_instruction((Impl *)instruction_local,pCStack_20);
        }
        else {
          p_Var9 = get_thread_log_callback();
          if (p_Var9 == (LoggingCallback)0x0) {
            fprintf(_stderr,
                    "[ERROR]: 16 or 64-bit RawBufferLoad on descriptors is only supported for SSBOs.\n"
                   );
            fflush(_stderr);
          }
          else {
            snprintf(local_1048,0x1000,
                     "16 or 64-bit RawBufferLoad on descriptors is only supported for SSBOs.\n");
            pvVar10 = get_thread_log_callback_userdata();
            (*p_Var9)(pvVar10,Error,local_1048);
          }
          impl_local._7_1_ = false;
        }
      }
    }
    else {
      impl_local._7_1_ = true;
    }
  }
  return impl_local._7_1_;
}

Assistant:

bool emit_raw_buffer_load_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	if (impl.ags.num_instructions == 1)
	{
		if (instruction->getOperand(2) == impl.ags.backdoor_instructions[0])
		{
			impl.ags.active_uav_ptr = impl.get_id_for_value(instruction->getOperand(1));
			impl.ags.active_uav_op = DXIL::Op::RawBufferLoad;
			impl.ags.active_read_backdoor = instruction;
			return true;
		}
	}

	if (!impl.composite_is_accessed(instruction))
		return true;

	spv::Id ptr_id = impl.get_id_for_value(instruction->getOperand(1));
	const auto &meta = impl.handle_to_resource_meta[ptr_id];

	if (meta.storage != spv::StorageClassPhysicalStorageBuffer)
	{
		auto *ret_component = instruction->getType()->getStructElementType(0);
		if (ret_component->getTypeID() != llvm::Type::TypeID::FloatTyID &&
		    !(ret_component->getTypeID() == llvm::Type::TypeID::IntegerTyID &&
		      ret_component->getIntegerBitWidth() == 32) &&
		    meta.storage != spv::StorageClassStorageBuffer)
		{
			LOGE("16 or 64-bit RawBufferLoad on descriptors is only supported for SSBOs.\n");
			return false;
		}

		// Ignore the mask. We'll read too much, but robustness should take care of any OOB.
		return emit_buffer_load_instruction(impl, instruction);
	}
	else
		return emit_physical_buffer_load_instruction(impl, instruction, meta.physical_pointer_meta);
}